

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

void __thiscall
Fossilize::DatabaseInterface::add_imported_metadata
          (DatabaseInterface *this,ExportedMetadataHeader *header)

{
  pointer *pppEVar1;
  Impl *pIVar2;
  iterator __position;
  ExportedMetadataHeader *local_8;
  
  pIVar2 = this->impl;
  __position._M_current =
       (pIVar2->imported_metadata).
       super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pIVar2->imported_metadata).
      super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = header;
    std::
    vector<Fossilize::ExportedMetadataHeader_const*,std::allocator<Fossilize::ExportedMetadataHeader_const*>>
    ::_M_realloc_insert<Fossilize::ExportedMetadataHeader_const*const&>
              ((vector<Fossilize::ExportedMetadataHeader_const*,std::allocator<Fossilize::ExportedMetadataHeader_const*>>
                *)&pIVar2->imported_metadata,__position,&local_8);
  }
  else {
    *__position._M_current = header;
    pppEVar1 = &(pIVar2->imported_metadata).
                super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  return;
}

Assistant:

void DatabaseInterface::add_imported_metadata(const ExportedMetadataHeader *header)
{
	impl->imported_metadata.push_back(header);
}